

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

QPDFObjGen __thiscall QPDFWriter::getRenumberedObjGen(QPDFWriter *this,QPDFObjGen og)

{
  element_type *peVar1;
  long lVar2;
  Object *pOVar3;
  QPDFObjGen QVar4;
  ulong uVar5;
  ulong idx;
  
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  idx = (ulong)og.obj;
  lVar2 = *(long *)&(peVar1->obj).super_ObjTable<QPDFWriter::Object>.
                    super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                    super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                    _M_impl;
  uVar5 = ((long)*(pointer *)
                  ((long)&(peVar1->obj).super_ObjTable<QPDFWriter::Object>.
                          super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                          super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                  + 8) - lVar2 >> 2) * -0x5555555555555555;
  if (uVar5 < idx || uVar5 - idx == 0) {
    pOVar3 = ObjTable<QPDFWriter::Object>::large_element
                       (&(peVar1->obj).super_ObjTable<QPDFWriter::Object>,idx);
  }
  else {
    pOVar3 = (Object *)(lVar2 + idx * 0xc);
  }
  QVar4.gen = 0;
  QVar4.obj = pOVar3->renumber;
  return QVar4;
}

Assistant:

QPDFObjGen
QPDFWriter::getRenumberedObjGen(QPDFObjGen og)
{
    return QPDFObjGen(m->obj[og].renumber, 0);
}